

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tableview.cpp
# Opt level: O3

void __thiscall
QtMWidgets::TableViewCell::setAccessoryWidget(TableViewCell *this,QWidget *accessory)

{
  QWidget *pQVar1;
  TableViewCellPrivate *pTVar2;
  
  pTVar2 = (this->d).d;
  pQVar1 = pTVar2->accessoryWidget;
  if (accessory != (QWidget *)0x0 && pQVar1 != accessory) {
    if (pQVar1 != (QWidget *)0x0) {
      (**(code **)(*(long *)pQVar1 + 0x20))();
      pTVar2 = (this->d).d;
    }
    pTVar2->accessoryWidget = (QWidget *)0x0;
    if (*(TableViewCell **)(*(long *)(accessory + 8) + 0x10) != this) {
      QWidget::setParent(accessory);
      pTVar2 = (this->d).d;
    }
    pTVar2->accessoryWidget = accessory;
    pTVar2->layout->accessoryWidget = accessory;
    QLayout::update();
    QWidget::show();
    QWidget::updateGeometry();
    return;
  }
  return;
}

Assistant:

void
TableViewCell::setAccessoryWidget( QWidget * accessory )
{
	if( accessory == d->accessoryWidget || !accessory )
		return;

	delete d->accessoryWidget;
	d->accessoryWidget = 0;
	if( accessory->parentWidget() != this )
		accessory->setParent( this );
	d->accessoryWidget = accessory;
	d->layout->setAccessoryWidget( d->accessoryWidget );
	d->accessoryWidget->show();

	updateGeometry();
}